

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O3

void __thiscall
iDynTree::RevoluteJoint::computeJointTorque
          (RevoluteJoint *this,VectorDynSize *jntPos,Wrench *internalWrench,
          LinkIndex linkThatAppliesWrench,LinkIndex linkOnWhichWrenchIsApplied,
          VectorDynSize *jntTorques)

{
  int iVar1;
  undefined4 extraout_var;
  double *pdVar2;
  double dVar3;
  double dVar4;
  SpatialMotionVector S;
  GeomVector3 local_58;
  GeomVector3 local_40;
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])();
  pdVar2 = (double *)iDynTree::VectorDynSize::operator()(jntTorques,CONCAT44(extraout_var,iVar1));
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0xc])
            (&local_58,this,0,linkOnWhichWrenchIsApplied,LINK_INVALID_INDEX);
  dVar3 = (double)iDynTree::GeomVector3::dot(&local_58);
  dVar4 = (double)iDynTree::GeomVector3::dot(&local_40);
  *pdVar2 = dVar4 + dVar3;
  return;
}

Assistant:

void RevoluteJoint::computeJointTorque(const VectorDynSize& jntPos, const Wrench& internalWrench,
                                       LinkIndex linkThatAppliesWrench, LinkIndex linkOnWhichWrenchIsApplied,
                                       VectorDynSize& jntTorques) const
{
    double & tau = jntTorques(this->getDOFsOffset());

    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,linkOnWhichWrenchIsApplied);
    tau = S.dot(internalWrench);

    return;
}